

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.h
# Opt level: O0

TestOneof2_NestedMessage * __thiscall
proto2_unittest::TestOneof2::release_foo_message(TestOneof2 *this)

{
  FooCase FVar1;
  Arena *pAVar2;
  TestOneof2 *local_20;
  TestOneof2_NestedMessage *temp;
  TestOneof2 *this_local;
  
  FVar1 = foo_case(this);
  if (FVar1 == kFooMessage) {
    clear_has_foo(this);
    local_20 = *(TestOneof2 **)((long)&this->field_0 + 0x18);
    pAVar2 = google::protobuf::MessageLite::GetArena((MessageLite *)this);
    if (pAVar2 != (Arena *)0x0) {
      local_20 = (TestOneof2 *)
                 google::protobuf::internal::
                 DuplicateIfNonNull<proto2_unittest::TestOneof2_NestedMessage>
                           ((TestOneof2_NestedMessage *)local_20);
    }
    (this->field_0)._impl_.foo_.foo_message_ = (Message *)0x0;
    this_local = local_20;
  }
  else {
    this_local = (TestOneof2 *)0x0;
  }
  return (TestOneof2_NestedMessage *)this_local;
}

Assistant:

inline ::proto2_unittest::TestOneof2_NestedMessage* PROTOBUF_NULLABLE TestOneof2::release_foo_message() {
  // @@protoc_insertion_point(field_release:proto2_unittest.TestOneof2.foo_message)
  if (foo_case() == kFooMessage) {
    clear_has_foo();
    auto* temp = reinterpret_cast<::proto2_unittest::TestOneof2_NestedMessage*>(_impl_.foo_.foo_message_);
    if (GetArena() != nullptr) {
      temp = ::google::protobuf::internal::DuplicateIfNonNull(temp);
    }
    _impl_.foo_.foo_message_ = nullptr;
    return temp;
  } else {
    return nullptr;
  }
}